

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_4447fb::PrefixExpr::printLeft(PrefixExpr *this,OutputStream *S)

{
  StringView local_48;
  StringView local_38;
  char *local_28;
  char *local_20;
  OutputStream *local_18;
  OutputStream *S_local;
  PrefixExpr *this_local;
  
  local_28 = (this->Prefix).First;
  local_20 = (this->Prefix).Last;
  local_18 = S;
  S_local = (OutputStream *)this;
  OutputStream::operator+=(S,this->Prefix);
  StringView::StringView(&local_38,"(");
  OutputStream::operator+=(local_18,local_38);
  Node::print(this->Child,local_18);
  StringView::StringView(&local_48,")");
  OutputStream::operator+=(local_18,local_48);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += Prefix;
    S += "(";
    Child->print(S);
    S += ")";
  }